

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * ExtractValue(InstructionVMEvalContext *ctx,VmConstant *value,uint offset,VmType type)

{
  double dVar1;
  VmType type_00;
  bool bVar2;
  int iVar3;
  double *__src;
  undefined4 extraout_var;
  VmConstant *this;
  InstructionVMEvalContext *pIVar4;
  VmConstant *result;
  char *tmp_3;
  unsigned_long_long pointer;
  longlong tmp_2;
  double tmp_1;
  int tmp;
  char *source;
  uint offset_local;
  VmConstant *value_local;
  InstructionVMEvalContext *ctx_local;
  VmType type_local;
  
  type_local._0_8_ = type.structType;
  pIVar4 = type._0_8_;
  ctx_local = pIVar4;
  if (value->sValue == (char *)0x0) {
    __assert_fail("value->sValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x102,
                  "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                 );
  }
  ctx_local._4_4_ = type.size;
  if (offset + ctx_local._4_4_ <= (value->super_VmValue).type.size) {
    __src = (double *)(value->sValue + offset);
    bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
    if (bVar2) {
      type_local.structType =
           (TypeBase *)CreateConstantInt(ctx->allocator,(SynBase *)0x0,*(int *)__src);
    }
    else {
      bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Double);
      if (bVar2) {
        type_local.structType =
             (TypeBase *)CreateConstantDouble(ctx->allocator,(SynBase *)0x0,*__src);
      }
      else {
        bVar2 = VmType::operator==((VmType *)&ctx_local,&VmType::Long);
        if (bVar2) {
          type_local.structType =
               (TypeBase *)CreateConstantLong(ctx->allocator,(SynBase *)0x0,(longlong)*__src);
        }
        else if ((int)ctx_local == 6) {
          dVar1 = *__src;
          if ((double)((ulong)dVar1 & 0xffffffff) != dVar1) {
            __assert_fail("unsigned(pointer) == pointer",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                          ,0x128,
                          "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                         );
          }
          type_local.structType =
               (TypeBase *)
               CreateConstantPointer
                         (ctx->allocator,(SynBase *)0x0,SUB84(dVar1,0),(VariableData *)0x0,
                          (TypeBase *)type_local._0_8_,false);
        }
        else {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)ctx_local >> 0x20);
          memcpy((char *)CONCAT44(extraout_var,iVar3),__src,(ulong)ctx_local >> 0x20);
          this = InstructionVMEvalContext::get<VmConstant>(ctx);
          type_00.structType = (TypeBase *)type_local._0_8_;
          type_00._0_8_ = ctx_local;
          VmConstant::VmConstant(this,ctx->allocator,type_00,(SynBase *)0x0);
          this->sValue = (char *)CONCAT44(extraout_var,iVar3);
          type_local.structType = (TypeBase *)this;
        }
      }
    }
    return (VmConstant *)type_local.structType;
  }
  __assert_fail("offset + type.size <= value->type.size",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x103,
                "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
               );
}

Assistant:

VmConstant* ExtractValue(InstructionVMEvalContext &ctx, VmConstant *value, unsigned offset, VmType type)
{
	assert(value->sValue);
	assert(offset + type.size <= value->type.size);

	const char *source = value->sValue + offset;

	if(type == VmType::Int)
	{
		int tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantInt(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Double)
	{
		double tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantDouble(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Long)
	{
		long long tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantLong(ctx.allocator, NULL, tmp);
	}
	else if(type.type == VM_TYPE_POINTER)
	{
		unsigned long long pointer = 0;

		if(sizeof(void*) == 4)
		{
			unsigned tmp;
			memcpy(&tmp, source, sizeof(void*));
			pointer = tmp;
		}
		else
		{
			memcpy(&pointer, source, sizeof(void*));
		}

		assert(unsigned(pointer) == pointer);

		return CreateConstantPointer(ctx.allocator, NULL, unsigned(pointer), NULL, type.structType, false);
	}
	else
	{
		char *tmp = (char*)ctx.allocator->alloc(type.size);
		memcpy(tmp, source, type.size);

		VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

		result->sValue = tmp;

		return result;
	}
}